

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::get_annotate_handle_meta(Impl *impl,CallInst *instruction,AnnotateHandleMeta *meta)

{
  bool bVar1;
  ResourceType resource_type;
  uint uVar2;
  uint32_t uVar3;
  Value *pVVar4;
  CallInst *value;
  mapped_type *pmVar5;
  ConstantAggregate *this;
  Constant *pCVar6;
  APInt *pAVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  iterator iVar11;
  uint32_t binding_range_hi;
  uint32_t binding_range_lo;
  uint32_t non_uniform_int;
  uint32_t opcode;
  CallInst *local_40;
  uint64_t local_38;
  
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  value = LLVMBC::dyn_cast<LLVMBC::CallInst>(pVVar4);
  if (value != (CallInst *)0x0) {
    bVar1 = get_constant_operand(&value->super_Instruction,0,&opcode);
    if (!bVar1) {
      return false;
    }
    meta->resource_op = opcode;
    non_uniform_int = 0;
    if (opcode == 0xa0) {
      local_40 = (CallInst *)LLVMBC::Instruction::getOperand(&value->super_Instruction,1);
      iVar11 = std::
               _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&local_40);
      if (iVar11.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_40 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        std::__detail::
        _Insert<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&impl->llvm_annotate_handle_lib_uses,(value_type *)&local_40);
        meta->resource_type =
             *(ResourceType *)
              ((long)iVar11.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x10);
        meta->binding_index =
             *(uint32_t *)
              ((long)iVar11.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                     ._M_cur + 0x14);
        meta->offset = *(Value **)
                        ((long)iVar11.
                               super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                               ._M_cur + 0x18);
        non_uniform_int =
             (uint32_t)
             *(byte *)((long)iVar11.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                             ._M_cur + 0x28);
LAB_00153863:
        meta->non_uniform = non_uniform_int != 0;
        return true;
      }
    }
    else if (opcode == 0xd9) {
      pVVar4 = LLVMBC::Instruction::getOperand(&value->super_Instruction,2);
      meta->offset = pVVar4;
      bVar1 = get_constant_operand(&value->super_Instruction,3,&non_uniform_int);
      if (bVar1) {
        pVVar4 = LLVMBC::Instruction::getOperand(&value->super_Instruction,1);
        this = LLVMBC::dyn_cast<LLVMBC::ConstantAggregate>(pVVar4);
        if (this == (ConstantAggregate *)0x0) {
          pVVar4 = LLVMBC::Instruction::getOperand(&value->super_Instruction,1);
          bVar1 = LLVMBC::isa<LLVMBC::ConstantAggregateZero>(pVVar4);
          if (!bVar1) {
            return false;
          }
          meta->resource_type = SRV;
          binding_range_lo = 0;
          binding_range_hi = 0;
          uVar3 = 0;
          resource_type = SRV;
        }
        else {
          uVar2 = LLVMBC::ConstantAggregate::getNumOperands(this);
          if (uVar2 != 4) {
            return false;
          }
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,0);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          local_38 = LLVMBC::APInt::getZExtValue(pAVar7);
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,1);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar8 = LLVMBC::APInt::getZExtValue(pAVar7);
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,2);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar9 = LLVMBC::APInt::getZExtValue(pAVar7);
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,3);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar10 = LLVMBC::APInt::getZExtValue(pAVar7);
          resource_type = (ResourceType)uVar10;
          meta->resource_type = resource_type;
          binding_range_lo = (uint32_t)local_38;
          binding_range_hi = (uint32_t)uVar8;
          uVar3 = (uint32_t)uVar9;
        }
        uVar3 = Converter::Impl::find_binding_meta_index
                          (impl,binding_range_lo,binding_range_hi,uVar3,resource_type);
        meta->binding_index = uVar3;
        if (uVar3 == 0xffffffff) {
          return false;
        }
        goto LAB_00153863;
      }
    }
    else if (opcode == 0xda) {
      local_40 = instruction;
      pmVar5 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_annotate_handle_uses,(key_type *)&local_40);
      meta->resource_type = pmVar5->resource_type;
      meta->binding_index = 0xffffffff;
      pVVar4 = LLVMBC::Instruction::getOperand(&value->super_Instruction,1);
      meta->offset = pVVar4;
      bVar1 = get_constant_operand(&value->super_Instruction,3,&non_uniform_int);
      if (bVar1) goto LAB_00153863;
    }
  }
  return false;
}

Assistant:

bool get_annotate_handle_meta(Converter::Impl &impl, const llvm::CallInst *instruction,
                              AnnotateHandleMeta &meta)
{
	auto *handle = llvm::dyn_cast<llvm::CallInst>(instruction->getOperand(1));
	if (!handle)
		return false;

	uint32_t opcode;
	if (!get_constant_operand(handle, 0, &opcode))
		return false;

	meta.resource_op = DXIL::Op(opcode);
	uint32_t non_uniform_int = 0;

	if (meta.resource_op == DXIL::Op::CreateHandleFromHeap)
	{
		auto &annotation = impl.llvm_annotate_handle_uses[instruction];
		meta.resource_type = annotation.resource_type;
		meta.binding_index = UINT32_MAX; // Direct heap access.

		meta.offset = handle->getOperand(1);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleFromBinding)
	{
		meta.offset = handle->getOperand(2);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;

		if (auto *res_type = llvm::dyn_cast<llvm::ConstantAggregate>(handle->getOperand(1)))
		{
			if (res_type->getNumOperands() != 4)
				return false;

			uint32_t binding_range_lo = res_type->getOperand(0)->getUniqueInteger().getZExtValue();
			uint32_t binding_range_hi = res_type->getOperand(1)->getUniqueInteger().getZExtValue();
			uint32_t binding_space = res_type->getOperand(2)->getUniqueInteger().getZExtValue();
			meta.resource_type = DXIL::ResourceType(res_type->getOperand(3)->getUniqueInteger().getZExtValue());
			meta.binding_index = impl.find_binding_meta_index(
				binding_range_lo, binding_range_hi,
				binding_space, meta.resource_type);

			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else if (llvm::isa<llvm::ConstantAggregateZero>(handle->getOperand(1)))
		{
			meta.resource_type = DXIL::ResourceType(0);
			meta.binding_index = impl.find_binding_meta_index(0, 0, 0, meta.resource_type);
			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleForLib)
	{
		auto itr = impl.llvm_global_variable_to_resource_mapping.find(handle->getOperand(1));
		if (itr == impl.llvm_global_variable_to_resource_mapping.end())
			return false;

		// Marks that the CreateHandleForLib is a dummy and should not actually emit a resource handle.
		impl.llvm_annotate_handle_lib_uses.insert(instruction->getOperand(1));

		meta.resource_type = itr->second.type;
		meta.binding_index = itr->second.meta_index;
		meta.offset = itr->second.offset;
		non_uniform_int = uint32_t(itr->second.non_uniform);
	}
	else
		return false;

	meta.non_uniform = non_uniform_int != 0;
	return true;
}